

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O0

void Eigen::internal::
     apply_rotation_in_the_plane<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double>
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *_x,
               Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *_y,
               JacobiRotation<double> *j)

{
  double dVar1;
  double dVar2;
  Index IVar3;
  Index IVar4;
  double dVar5;
  Scalar SVar6;
  double *pdVar7;
  void *extraout_RDX;
  void *pvVar8;
  double extraout_XMM0_Qa;
  type tVar9;
  Packet2d adVar10;
  double adVar11 [2];
  Scalar yi_5;
  Scalar xi_5;
  Index i_4;
  Scalar yi_4;
  Scalar xi_4;
  Index i_3;
  double local_2c8 [2];
  double local_2b8 [2];
  double local_2a8 [2];
  double local_298 [2];
  double local_288 [2];
  double dStack_278;
  Packet yi_3;
  Packet xi_3;
  double local_248 [2];
  double local_238 [2];
  double local_228 [2];
  double local_218 [2];
  double local_208 [2];
  double local_1f8 [2];
  double local_1e8 [2];
  double local_1d8 [2];
  double local_1c8 [2];
  double local_1b8 [2];
  double local_1a8 [2];
  double dStack_198;
  Packet yi1;
  Packet yi_2;
  Packet xi1;
  Packet xi_2;
  Index i_2;
  Index peelingEnd;
  double local_138 [2];
  double local_128 [2];
  double local_118 [2];
  double local_108 [2];
  double local_f8 [2];
  double dStack_e8;
  Packet yi_1;
  Packet xi_1;
  double local_c0;
  Index i_1;
  Scalar *py;
  Scalar *px;
  Scalar yi;
  Scalar xi;
  Index i;
  double dStack_88;
  conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
  pcj;
  Packet ps;
  Packet pc;
  Index alignedEnd;
  Index alignedStart;
  double s;
  double c;
  Scalar *y;
  Scalar *x;
  Index incry;
  Index incrx;
  Index size;
  JacobiRotation<double> *j_local;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *_y_local;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *_x_local;
  
  size = (Index)j;
  j_local = (JacobiRotation<double> *)_y;
  _y_local = _x;
  IVar3 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)_x);
  IVar4 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)j_local);
  if (IVar3 != IVar4) {
    __assert_fail("_x.size() == _y.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Jacobi/Jacobi.h"
                  ,0x133,
                  "void Eigen::internal::apply_rotation_in_the_plane(VectorX &, VectorY &, const JacobiRotation<OtherScalar> &) [VectorX = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, VectorY = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherScalar = double]"
                 );
  }
  incrx = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)_y_local);
  incry = BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true,_true>::innerStride
                    ((BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true> *
                     )_y_local);
  x = (Scalar *)
      BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true,_true>::innerStride
                ((BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true> *)
                 j_local);
  y = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::coeffRef
                ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
                 _y_local,0);
  pvVar8 = (void *)0x0;
  c = (double)MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
              coeffRef((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                        *)j_local,0);
  JacobiRotation<double>::c((JacobiRotation<double> *)size,pvVar8,extraout_RDX);
  s = extraout_XMM0_Qa;
  alignedStart = (Index)JacobiRotation<double>::s((JacobiRotation<double> *)size);
  if ((((s != 1.0) || (NAN(s))) || ((double)alignedStart != 0.0)) || (NAN((double)alignedStart))) {
    if ((incry == 1) && (x == (Scalar *)0x1)) {
      xi_2[1] = (double)first_aligned<double,long>((double *)c,incrx);
      xi_4 = (Scalar)((long)xi_2[1] + ((incrx - (long)xi_2[1]) / 2) * 2);
      adVar10 = pset1<double__vector(2)>(&s);
      ps[1] = adVar10[0];
      adVar10 = pset1<double__vector(2)>((double *)&alignedStart);
      dStack_88 = adVar10[0];
      for (xi = 0.0; dVar5 = s, (long)xi < (long)xi_2[1]; xi = (Scalar)((long)xi + 1)) {
        dVar1 = y[(long)xi];
        dVar2 = *(double *)((long)c + (long)xi * 8);
        tVar9 = numext::conj<double>((double *)&alignedStart);
        y[(long)xi] = dVar5 * dVar1 + tVar9 * dVar2;
        dVar5 = -(double)alignedStart;
        tVar9 = numext::conj<double>(&s);
        *(double *)((long)c + (long)xi * 8) = dVar5 * dVar1 + tVar9 * dVar2;
      }
      py = y + (long)xi_2[1];
      i_1 = (long)c + (long)xi_2[1] * 8;
      dVar5 = (double)first_aligned<double,long>(y,incrx);
      local_c0 = xi_2[1];
      if (dVar5 == xi_2[1]) {
        for (; (long)local_c0 < (long)xi_4; local_c0 = (double)((long)local_c0 + 2)) {
          adVar10 = pload<double__vector(2)>(py);
          yi_1[1] = adVar10[0];
          adVar10 = pload<double__vector(2)>((double *)i_1);
          dStack_e8 = adVar10[0];
          adVar10 = pmul<double__vector(2)>((Packet2d *)(ps + 1),(Packet2d *)(yi_1 + 1));
          local_108[0] = adVar10[0];
          adVar11 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&i + 7),(double (*) [2])&stack0xffffffffffffff78,
                           (double (*) [2])&dStack_e8);
          local_118[0] = adVar11[0];
          adVar10 = padd<double__vector(2)>(&local_108,&local_118);
          local_f8[0] = adVar10[0];
          pstore<double,double__vector(2)>(py,&local_f8);
          adVar11 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&i + 7),(double (*) [2])(ps + 1),(double (*) [2])&dStack_e8);
          local_138[0] = adVar11[0];
          adVar10 = pmul<double__vector(2)>
                              ((Packet2d *)&stack0xffffffffffffff78,(Packet2d *)(yi_1 + 1));
          peelingEnd = adVar10[0];
          adVar10 = psub<double__vector(2)>(&local_138,(Packet2d *)&peelingEnd);
          local_128[0] = adVar10[0];
          pstore<double,double__vector(2)>((double *)i_1,&local_128);
          py = py + 2;
          i_1 = i_1 + 0x10;
        }
      }
      else {
        SVar6 = (Scalar)((long)xi_2[1] + ((incrx - (long)xi_2[1]) / 4) * 4);
        for (; (long)xi_2[1] < (long)SVar6; xi_2[1] = (double)((long)xi_2[1] + 4)) {
          adVar10 = ploadu<double__vector(2)>(py);
          xi1[1] = adVar10[0];
          adVar10 = ploadu<double__vector(2)>(py + 2);
          yi_2[1] = adVar10[0];
          adVar10 = pload<double__vector(2)>((double *)i_1);
          yi1[1] = adVar10[0];
          adVar10 = pload<double__vector(2)>((double *)(i_1 + 0x10));
          dStack_198 = adVar10[0];
          adVar10 = pmul<double__vector(2)>((Packet2d *)(ps + 1),(Packet2d *)(xi1 + 1));
          local_1b8[0] = adVar10[0];
          adVar11 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&i + 7),(double (*) [2])&stack0xffffffffffffff78,
                           (double (*) [2])(yi1 + 1));
          local_1c8[0] = adVar11[0];
          adVar10 = padd<double__vector(2)>(&local_1b8,&local_1c8);
          local_1a8[0] = adVar10[0];
          pstoreu<double,double__vector(2)>(py,&local_1a8);
          adVar10 = pmul<double__vector(2)>((Packet2d *)(ps + 1),(Packet2d *)(yi_2 + 1));
          local_1e8[0] = adVar10[0];
          adVar11 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&i + 7),(double (*) [2])&stack0xffffffffffffff78,
                           (double (*) [2])&dStack_198);
          local_1f8[0] = adVar11[0];
          adVar10 = padd<double__vector(2)>(&local_1e8,&local_1f8);
          local_1d8[0] = adVar10[0];
          pstoreu<double,double__vector(2)>(py + 2,&local_1d8);
          adVar11 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&i + 7),(double (*) [2])(ps + 1),(double (*) [2])(yi1 + 1));
          local_218[0] = adVar11[0];
          adVar10 = pmul<double__vector(2)>
                              ((Packet2d *)&stack0xffffffffffffff78,(Packet2d *)(xi1 + 1));
          local_228[0] = adVar10[0];
          adVar10 = psub<double__vector(2)>(&local_218,&local_228);
          local_208[0] = adVar10[0];
          pstore<double,double__vector(2)>((double *)i_1,&local_208);
          adVar11 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&i + 7),(double (*) [2])(ps + 1),(double (*) [2])&dStack_198);
          local_248[0] = adVar11[0];
          adVar10 = pmul<double__vector(2)>
                              ((Packet2d *)&stack0xffffffffffffff78,(Packet2d *)(yi_2 + 1));
          xi_3[1] = adVar10[0];
          adVar10 = psub<double__vector(2)>(&local_248,(Packet2d *)(xi_3 + 1));
          local_238[0] = adVar10[0];
          pstore<double,double__vector(2)>((double *)(i_1 + 0x10),&local_238);
          py = py + 4;
          i_1 = i_1 + 0x20;
        }
        if (xi_4 != SVar6) {
          adVar10 = ploadu<double__vector(2)>(y + (long)SVar6);
          yi_3[1] = adVar10[0];
          adVar10 = pload<double__vector(2)>((double *)((long)c + (long)SVar6 * 8));
          dStack_278 = adVar10[0];
          pdVar7 = y + (long)SVar6;
          adVar10 = pmul<double__vector(2)>((Packet2d *)(ps + 1),(Packet2d *)(yi_3 + 1));
          local_298[0] = adVar10[0];
          adVar11 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&i + 7),(double (*) [2])&stack0xffffffffffffff78,
                           (double (*) [2])&dStack_278);
          local_2a8[0] = adVar11[0];
          adVar10 = padd<double__vector(2)>(&local_298,&local_2a8);
          local_288[0] = adVar10[0];
          pstoreu<double,double__vector(2)>(pdVar7,&local_288);
          pdVar7 = (double *)((long)c + (long)SVar6 * 8);
          adVar11 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                    ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&i + 7),(double (*) [2])(ps + 1),(double (*) [2])&dStack_278);
          local_2c8[0] = adVar11[0];
          adVar10 = pmul<double__vector(2)>
                              ((Packet2d *)&stack0xffffffffffffff78,(Packet2d *)(yi_3 + 1));
          i_3 = adVar10[0];
          adVar10 = psub<double__vector(2)>(&local_2c8,(Packet2d *)&i_3);
          local_2b8[0] = adVar10[0];
          pstore<double,double__vector(2)>(pdVar7,&local_2b8);
        }
      }
      for (; dVar5 = s, (long)xi_4 < incrx; xi_4 = (Scalar)((long)xi_4 + 1)) {
        dVar1 = y[(long)xi_4];
        dVar2 = *(double *)((long)c + (long)xi_4 * 8);
        tVar9 = numext::conj<double>((double *)&alignedStart);
        y[(long)xi_4] = dVar5 * dVar1 + tVar9 * dVar2;
        dVar5 = -(double)alignedStart;
        tVar9 = numext::conj<double>(&s);
        *(double *)((long)c + (long)xi_4 * 8) = dVar5 * dVar1 + tVar9 * dVar2;
      }
    }
    else {
      for (xi_5 = 0.0; dVar5 = s, (long)xi_5 < incrx; xi_5 = (Scalar)((long)xi_5 + 1)) {
        dVar1 = *y;
        dVar2 = *(double *)c;
        tVar9 = numext::conj<double>((double *)&alignedStart);
        *y = dVar5 * dVar1 + tVar9 * dVar2;
        dVar5 = -(double)alignedStart;
        tVar9 = numext::conj<double>(&s);
        *(double *)c = dVar5 * dVar1 + tVar9 * dVar2;
        y = y + incry;
        c = (double)((long)x * 8 + (long)c);
      }
    }
  }
  return;
}

Assistant:

void /*EIGEN_DONT_INLINE*/ apply_rotation_in_the_plane(VectorX& _x, VectorY& _y, const JacobiRotation<OtherScalar>& j)
{
  typedef typename VectorX::Index Index;
  typedef typename VectorX::Scalar Scalar;
  enum { PacketSize = packet_traits<Scalar>::size };
  typedef typename packet_traits<Scalar>::type Packet;
  eigen_assert(_x.size() == _y.size());
  Index size = _x.size();
  Index incrx = _x.innerStride();
  Index incry = _y.innerStride();

  Scalar* EIGEN_RESTRICT x = &_x.coeffRef(0);
  Scalar* EIGEN_RESTRICT y = &_y.coeffRef(0);
  
  OtherScalar c = j.c();
  OtherScalar s = j.s();
  if (c==OtherScalar(1) && s==OtherScalar(0))
    return;

  /*** dynamic-size vectorized paths ***/

  if(VectorX::SizeAtCompileTime == Dynamic &&
    (VectorX::Flags & VectorY::Flags & PacketAccessBit) &&
    ((incrx==1 && incry==1) || PacketSize == 1))
  {
    // both vectors are sequentially stored in memory => vectorization
    enum { Peeling = 2 };

    Index alignedStart = internal::first_aligned(y, size);
    Index alignedEnd = alignedStart + ((size-alignedStart)/PacketSize)*PacketSize;

    const Packet pc = pset1<Packet>(c);
    const Packet ps = pset1<Packet>(s);
    conj_helper<Packet,Packet,NumTraits<Scalar>::IsComplex,false> pcj;

    for(Index i=0; i<alignedStart; ++i)
    {
      Scalar xi = x[i];
      Scalar yi = y[i];
      x[i] =  c * xi + numext::conj(s) * yi;
      y[i] = -s * xi + numext::conj(c) * yi;
    }

    Scalar* EIGEN_RESTRICT px = x + alignedStart;
    Scalar* EIGEN_RESTRICT py = y + alignedStart;

    if(internal::first_aligned(x, size)==alignedStart)
    {
      for(Index i=alignedStart; i<alignedEnd; i+=PacketSize)
      {
        Packet xi = pload<Packet>(px);
        Packet yi = pload<Packet>(py);
        pstore(px, padd(pmul(pc,xi),pcj.pmul(ps,yi)));
        pstore(py, psub(pcj.pmul(pc,yi),pmul(ps,xi)));
        px += PacketSize;
        py += PacketSize;
      }
    }
    else
    {
      Index peelingEnd = alignedStart + ((size-alignedStart)/(Peeling*PacketSize))*(Peeling*PacketSize);
      for(Index i=alignedStart; i<peelingEnd; i+=Peeling*PacketSize)
      {
        Packet xi   = ploadu<Packet>(px);
        Packet xi1  = ploadu<Packet>(px+PacketSize);
        Packet yi   = pload <Packet>(py);
        Packet yi1  = pload <Packet>(py+PacketSize);
        pstoreu(px, padd(pmul(pc,xi),pcj.pmul(ps,yi)));
        pstoreu(px+PacketSize, padd(pmul(pc,xi1),pcj.pmul(ps,yi1)));
        pstore (py, psub(pcj.pmul(pc,yi),pmul(ps,xi)));
        pstore (py+PacketSize, psub(pcj.pmul(pc,yi1),pmul(ps,xi1)));
        px += Peeling*PacketSize;
        py += Peeling*PacketSize;
      }
      if(alignedEnd!=peelingEnd)
      {
        Packet xi = ploadu<Packet>(x+peelingEnd);
        Packet yi = pload <Packet>(y+peelingEnd);
        pstoreu(x+peelingEnd, padd(pmul(pc,xi),pcj.pmul(ps,yi)));
        pstore (y+peelingEnd, psub(pcj.pmul(pc,yi),pmul(ps,xi)));
      }
    }

    for(Index i=alignedEnd; i<size; ++i)
    {
      Scalar xi = x[i];
      Scalar yi = y[i];
      x[i] =  c * xi + numext::conj(s) * yi;
      y[i] = -s * xi + numext::conj(c) * yi;
    }
  }

  /*** fixed-size vectorized path ***/
  else if(VectorX::SizeAtCompileTime != Dynamic &&
          (VectorX::Flags & VectorY::Flags & PacketAccessBit) &&
          (VectorX::Flags & VectorY::Flags & AlignedBit))
  {
    const Packet pc = pset1<Packet>(c);
    const Packet ps = pset1<Packet>(s);
    conj_helper<Packet,Packet,NumTraits<Scalar>::IsComplex,false> pcj;
    Scalar* EIGEN_RESTRICT px = x;
    Scalar* EIGEN_RESTRICT py = y;
    for(Index i=0; i<size; i+=PacketSize)
    {
      Packet xi = pload<Packet>(px);
      Packet yi = pload<Packet>(py);
      pstore(px, padd(pmul(pc,xi),pcj.pmul(ps,yi)));
      pstore(py, psub(pcj.pmul(pc,yi),pmul(ps,xi)));
      px += PacketSize;
      py += PacketSize;
    }
  }

  /*** non-vectorized path ***/
  else
  {
    for(Index i=0; i<size; ++i)
    {
      Scalar xi = *x;
      Scalar yi = *y;
      *x =  c * xi + numext::conj(s) * yi;
      *y = -s * xi + numext::conj(c) * yi;
      x += incrx;
      y += incry;
    }
  }
}